

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcItem * isSelfJoinView(SrcList *pTabList,SrcItem *pThis,int iFirst,int iEnd)

{
  SrcItem *pSVar1;
  byte bVar2;
  byte bVar3;
  Schema *pSVar4;
  Select *pSVar5;
  char **ppcVar6;
  SrcItem *pSVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  
  pSVar7 = (SrcItem *)(pThis->u4).pSubq;
  ppcVar6 = &pSVar7->zName;
  if (((*ppcVar6)[7] & 1U) != 0) {
    return (SrcItem *)0x0;
  }
  lVar8 = (long)iFirst;
  if (iEnd <= iFirst) {
    iEnd = iFirst;
  }
LAB_0018c8ed:
  if (lVar8 == iEnd) {
    return (SrcItem *)0x0;
  }
  bVar9 = 1;
  if ((*(ushort *)&pTabList->a[lVar8].fg.field_0x1 & 0x44) == 4) {
    pSVar1 = pTabList->a + lVar8;
    if (((pSVar1->zName != (char *)0x0) &&
        (pSVar4 = pSVar1->pSTab->pSchema, pSVar4 == pThis->pSTab->pSchema)) &&
       (pThis->zName != (char *)0x0)) {
      lVar10 = 0;
      do {
        bVar2 = pSVar1->zName[lVar10];
        bVar3 = pThis->zName[lVar10];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_0018c967;
        }
        else if (""[bVar2] != ""[bVar3]) break;
        lVar10 = lVar10 + 1;
      } while( true );
    }
  }
  goto LAB_0018c92a;
LAB_0018c967:
  pSVar5 = ((pSVar1->u4).pSubq)->pSelect;
  if (((pSVar4 != (Schema *)0x0) || (*(u32 *)(*ppcVar6 + 0x10) == pSVar5->selId)) &&
     (bVar9 = *(byte *)((long)&pSVar5->selFlags + 3), (bVar9 & 1) == 0)) {
    pSVar7 = pSVar1;
  }
LAB_0018c92a:
  lVar8 = lVar8 + 1;
  if ((bVar9 & 1) == 0) {
    return pSVar7;
  }
  goto LAB_0018c8ed;
}

Assistant:

static SrcItem *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  SrcItem *pThis,              /* Search for prior reference to this subquery */
  int iFirst, int iEnd        /* Range of FROM-clause entries to search. */
){
  SrcItem *pItem;
  Select *pSel;
  assert( pThis->fg.isSubquery );
  pSel = pThis->u4.pSubq->pSelect;
  assert( pSel!=0 );
  if( pSel->selFlags & SF_PushDown ) return 0;
  while( iFirst<iEnd ){
    Select *pS1;
    pItem = &pTabList->a[iFirst++];
    if( !pItem->fg.isSubquery ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    assert( pItem->pSTab!=0 );
    assert( pThis->pSTab!=0 );
    if( pItem->pSTab->pSchema!=pThis->pSTab->pSchema ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    pS1 = pItem->u4.pSubq->pSelect;
    if( pItem->pSTab->pSchema==0 && pSel->selId!=pS1->selId ){
      /* The query flattener left two different CTE tables with identical
      ** names in the same FROM clause. */
      continue;
    }
    if( pS1->selFlags & SF_PushDown ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}